

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O2

int lj_cf_load(lua_State *L)

{
  uint uVar1;
  int iVar2;
  GCstr *pGVar3;
  GCstr *pGVar4;
  GCstr *pGVar5;
  GCstr *mode;
  
  pGVar3 = lj_lib_optstr(L,2);
  pGVar4 = lj_lib_optstr(L,3);
  if ((L->base < L->top) &&
     (uVar1 = (L->base->field_2).it, uVar1 == 0xfffffffb || uVar1 < 0xffff0000)) {
    pGVar5 = lj_lib_checkstr(L,1);
    lua_settop(L,4);
    if (pGVar3 == (GCstr *)0x0) {
      pGVar3 = pGVar5;
    }
    mode = pGVar4 + 1;
    if (pGVar4 == (GCstr *)0x0) {
      mode = (GCstr *)0x0;
    }
    iVar2 = luaL_loadbufferx(L,(char *)(pGVar5 + 1),(ulong)pGVar5->len,(char *)(pGVar3 + 1),
                             (char *)mode);
  }
  else {
    lj_lib_checkfunc(L,1);
    lua_settop(L,5);
    pGVar5 = (GCstr *)"=(load)";
    if (pGVar3 != (GCstr *)0x0) {
      pGVar5 = pGVar3 + 1;
    }
    pGVar3 = pGVar4 + 1;
    if (pGVar4 == (GCstr *)0x0) {
      pGVar3 = (GCstr *)0x0;
    }
    iVar2 = lua_loadx(L,reader_func,(void *)0x0,(char *)pGVar5,(char *)pGVar3);
  }
  iVar2 = load_aux(L,iVar2,4);
  return iVar2;
}

Assistant:

LJLIB_CF(load)
{
  GCstr *name = lj_lib_optstr(L, 2);
  GCstr *mode = lj_lib_optstr(L, 3);
  int status;
  if (L->base < L->top && (tvisstr(L->base) || tvisnumber(L->base))) {
    GCstr *s = lj_lib_checkstr(L, 1);
    lua_settop(L, 4);  /* Ensure env arg exists. */
    status = luaL_loadbufferx(L, strdata(s), s->len, strdata(name ? name : s),
			      mode ? strdata(mode) : NULL);
  } else {
    lj_lib_checkfunc(L, 1);
    lua_settop(L, 5);  /* Reserve a slot for the string from the reader. */
    status = lua_loadx(L, reader_func, NULL, name ? strdata(name) : "=(load)",
		       mode ? strdata(mode) : NULL);
  }
  return load_aux(L, status, 4);
}